

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O2

sexp_conflict sexp_sweep(sexp_conflict ctx,size_t *sum_freed_ptr)

{
  sexp_conflict psVar1;
  sexp_heap_conflict psVar2;
  sexp_conflict psVar3;
  char *pcVar4;
  sexp_uint_t sVar5;
  sexp_conflict psVar6;
  ulong uVar7;
  sexp_uint_t sVar8;
  ulong uVar9;
  ulong uVar10;
  sexp_heap_conflict *ppsVar11;
  sexp_conflict psVar12;
  sexp_conflict x;
  ulong local_50;
  size_t local_48;
  
  ppsVar11 = &(ctx->value).context.heap;
  local_48 = 0;
  local_50 = 0;
  do {
    psVar2 = *ppsVar11;
    if (psVar2 == (sexp_heap_conflict)0x0) {
      if (sum_freed_ptr != (size_t *)0x0) {
        *sum_freed_ptr = local_48;
      }
      return (sexp_conflict)(local_50 * 2 + 1);
    }
    psVar3 = (sexp_conflict)psVar2->free_list;
    pcVar4 = psVar2->data;
    x = (sexp_conflict)(pcVar4 + 0x20);
    sVar5 = psVar2->size;
    psVar12 = psVar3;
    while (psVar6 = psVar12, x < (sexp_conflict)(pcVar4 + sVar5)) {
      do {
        psVar12 = psVar6;
        psVar6 = (psVar12->value).type.name;
        if (psVar6 == (sexp_conflict)0x0) break;
      } while (psVar6 < x);
      if (psVar6 == x) {
        x = (sexp_conflict)((long)&x->tag + *(ulong *)psVar6);
      }
      else {
        sVar8 = sexp_allocated_bytes(ctx,x);
        uVar9 = sVar8 + 0x1f & 0xffffffffffffffe0;
        if (x->markedp == '\0') {
          uVar10 = *(ulong *)psVar12;
          if (((sexp_conflict)((long)&psVar12->tag + uVar10) == x) && (psVar12 != psVar3)) {
            if (((psVar6 == (sexp_conflict)0x0) || (uVar7 = *(ulong *)psVar6, uVar7 == 0)) ||
               (psVar1 = (sexp_conflict)((long)&x->tag + uVar9), psVar1 != psVar6)) {
              uVar10 = uVar10 + uVar9;
              x = (sexp_conflict)((long)&x->tag + uVar9);
            }
            else {
              (psVar12->value).flonum = (double)(psVar6->value).flonum;
              uVar10 = uVar10 + uVar9 + uVar7;
              x = (sexp_conflict)((long)&psVar1->tag + uVar7);
            }
            psVar12->tag = (int)uVar10;
            psVar12->markedp = (char)(uVar10 >> 0x20);
            *(int3 *)&psVar12->field_0x5 = (int3)(uVar10 >> 0x28);
          }
          else {
            if ((psVar6 == (sexp_conflict)0x0) ||
               ((*(ulong *)psVar6 == 0 || ((sexp_conflict)((long)&x->tag + uVar9) != psVar6)))) {
              x->tag = (int)uVar9;
              x->markedp = (char)(uVar9 >> 0x20);
              *(int3 *)&x->field_0x5 = (int3)(uVar9 >> 0x28);
              (x->value).type.name = psVar6;
              (psVar12->value).type.name = x;
              uVar10 = uVar9;
            }
            else {
              *(ulong *)x = *(ulong *)psVar6 + uVar9;
              (x->value).flonum = (double)(psVar6->value).flonum;
              (psVar12->value).type.name = x;
              uVar10 = *(ulong *)psVar6 + uVar9;
            }
            x = (sexp_conflict)((long)&x->tag + uVar10);
          }
          local_48 = local_48 + uVar9;
          if (local_50 < uVar10) {
            local_50 = uVar10;
          }
        }
        else {
          x->markedp = '\0';
          x = (sexp_conflict)((long)&x->tag + uVar9);
        }
      }
    }
    ppsVar11 = &psVar2->next;
  } while( true );
}

Assistant:

sexp sexp_sweep (sexp ctx, size_t *sum_freed_ptr) {
  size_t freed, max_freed=0, sum_freed=0, size;
  sexp_heap h = sexp_context_heap(ctx);
  sexp p, end;
  sexp_free_list q, r, s;
  /* scan over the whole heap */
  for ( ; h; h=h->next) {
    p = sexp_heap_first_block(h);
    q = h->free_list;
    end = sexp_heap_end(h);
    while (p < end) {
      /* find the preceding and succeeding free list pointers */
      for (r=q->next; r && ((char*)r<(char*)p); q=r, r=r->next)
        ;
      if ((char*)r == (char*)p) { /* this is a free block, skip it */
        p = (sexp) (((char*)p) + r->size);
        continue;
      }
      size = sexp_heap_align(sexp_allocated_bytes(ctx, p));
#if SEXP_USE_DEBUG_GC > 1
      if (!sexp_valid_object_p(ctx, p))
        fprintf(stderr, SEXP_BANNER("%p sweep: invalid object at %p"), ctx, p);
      if ((char*)q + q->size > (char*)p)
        fprintf(stderr, SEXP_BANNER("%p sweep: bad size at %p < %p + %lu"),
                ctx, p, q, q->size);
      if (r && ((char*)p)+size > (char*)r)
        fprintf(stderr, SEXP_BANNER("%p sweep: bad size at %p + %lu > %p"),
                ctx, p, size, r);
#endif
      if (!sexp_markedp(p)) {
        /* free p */
        sum_freed += size;
        if (((((char*)q) + q->size) == (char*)p) && (q != h->free_list)) {
          /* merge q with p */
          if (r && r->size && ((((char*)p)+size) == (char*)r)) {
            /* ... and with r */
            q->next = r->next;
            freed = q->size + size + r->size;
            p = (sexp) (((char*)p) + size + r->size);
          } else {
            freed = q->size + size;
            p = (sexp) (((char*)p)+size);
          }
          q->size = freed;
        } else {
          s = (sexp_free_list)p;
          if (r && r->size && ((((char*)p)+size) == (char*)r)) {
            /* merge p with r */
            s->size = size + r->size;
            s->next = r->next;
            q->next = s;
            freed = size + r->size;
          } else {
            s->size = size;
            s->next = r;
            q->next = s;
            freed = size;
          }
          p = (sexp) (((char*)p)+freed);
        }
        if (freed > max_freed)
          max_freed = freed;
      } else {
        sexp_markedp(p) = 0;
        p = (sexp) (((char*)p)+size);
      }
    }
  }
  if (sum_freed_ptr) *sum_freed_ptr = sum_freed;
  return sexp_make_fixnum(max_freed);
}